

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O3

void composition_solid_source_in(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (const_alpha == 0xff) {
    if (0 < length) {
      uVar2 = 0;
      do {
        uVar4 = (dest[uVar2] >> 0x18) * (color & 0xff00ff);
        uVar3 = (dest[uVar2] >> 0x18) * (color >> 8 & 0xff00ff);
        dest[uVar2] = uVar3 + 0x800080 + (uVar3 >> 8 & 0xff00ff) & 0xff00ff00 |
                      uVar4 + 0x800080 + (uVar4 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
        uVar2 = uVar2 + 1;
      } while ((uint)length != uVar2);
    }
  }
  else if (0 < length) {
    uVar4 = (color & 0xff00ff) * const_alpha;
    uVar3 = (color >> 8 & 0xff00ff) * const_alpha;
    uVar2 = 0;
    do {
      uVar5 = dest[uVar2];
      uVar1 = (uVar5 & 0xff00ff) * (0xff - const_alpha) +
              (uVar5 >> 0x18) * (uVar4 + (uVar4 >> 8 & 0xff00ff) + 0x800080 >> 8 & 0xff00ff);
      uVar5 = (uVar5 >> 8 & 0xff00ff) * (0xff - const_alpha) +
              (uVar5 >> 0x18) * ((uVar3 >> 8 & 0xff00ff) + uVar3 + 0x800080 >> 8 & 0xff00ff);
      dest[uVar2] = uVar5 + 0x800080 + (uVar5 >> 8 & 0xff00ff) & 0xff00ff00 |
                    uVar1 + 0x800080 + (uVar1 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
      uVar2 = uVar2 + 1;
    } while ((uint)length != uVar2);
  }
  return;
}

Assistant:

static void composition_solid_source_in(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(color, plutovg_alpha(dest[i]));
        }
    } else {
        color = BYTE_MUL(color, const_alpha);
        uint32_t cia = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            dest[i] = INTERPOLATE_PIXEL(color, plutovg_alpha(d), d, cia);
        }
    }
}